

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

size_t Curl_conn_get_max_concurrent(Curl_easy *data,connectdata *conn,int sockindex)

{
  Curl_cfilter *pCVar1;
  size_t local_40;
  CURLcode local_34;
  Curl_cfilter *cf;
  int n;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cf._4_4_ = 0;
  pCVar1 = conn->cfilter[sockindex];
  if (pCVar1 == (Curl_cfilter *)0x0) {
    local_34 = CURLE_UNKNOWN_OPTION;
  }
  else {
    n = sockindex;
    _result = conn;
    conn_local = (connectdata *)data;
    local_34 = (*pCVar1->cft->query)(pCVar1,data,1,(int *)((long)&cf + 4),(void *)0x0);
  }
  if ((local_34 == CURLE_OK) && (0 < cf._4_4_)) {
    local_40 = (size_t)cf._4_4_;
  }
  else {
    local_40 = 1;
  }
  return local_40;
}

Assistant:

size_t Curl_conn_get_max_concurrent(struct Curl_easy *data,
                                     struct connectdata *conn,
                                     int sockindex)
{
  CURLcode result;
  int n = 0;

  struct Curl_cfilter *cf = conn->cfilter[sockindex];
  result = cf ? cf->cft->query(cf, data, CF_QUERY_MAX_CONCURRENT,
                               &n, NULL) : CURLE_UNKNOWN_OPTION;
  return (result || n <= 0) ? 1 : (size_t)n;
}